

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::constant_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,
          bool inside_block_like_struct_scope,bool inside_struct_scope)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  SPIRType *type;
  SPIRConstantOp *pSVar5;
  SPIRUndef *pSVar6;
  SPIRConstant *c_00;
  int iVar7;
  char (*ts_1) [6];
  char (*ts_1_00) [4];
  byte bVar8;
  TypedID<(spirv_cross::Types)3> *elem;
  TypedID<(spirv_cross::Types)3> *pTVar9;
  char *pcVar10;
  char (*in_R9) [2];
  long lVar11;
  uint32_t index;
  ulong uVar12;
  SPIRType *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  SPIRType tmp_type;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
  bVar2 = Compiler::type_is_top_level_pointer(&this->super_Compiler,type);
  if (bVar2) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->backend).null_pointer_literal);
    return __return_storage_ptr__;
  }
  if ((c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size
      == 0) {
    if ((*(int *)&(type->super_IVariant).field_0xc != 0xf) ||
       ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0)) {
      if ((c->m).columns == 1) {
        (*(this->super_Compiler)._vptr_Compiler[0x19])(__return_storage_ptr__,this,c,0);
        if (!inside_struct_scope) {
          return __return_storage_ptr__;
        }
        if ((this->backend).boolean_in_struct_remapped_type == Boolean) {
          return __return_storage_ptr__;
        }
        if (*(int *)&(type->super_IVariant).field_0xc != 2) {
          return __return_storage_ptr__;
        }
        SPIRType::SPIRType(&tmp_type,type);
        tmp_type.super_IVariant._12_4_ = (this->backend).boolean_in_struct_remapped_type;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1a0,this,&tmp_type,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1c0,(spirv_cross *)&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                   (char (*) [2])__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,
                   in_R9);
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&tmp_type,this,type,0);
        ::std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tmp_type,"(");
        ::std::__cxx11::string::~string((string *)&tmp_type);
        uVar12 = 0;
        while (uVar12 < (c->m).columns) {
          uVar1 = (c->m).id[uVar12].id;
          if (uVar1 == 0) {
            (*(this->super_Compiler)._vptr_Compiler[0x19])(&tmp_type,this,c,uVar12 & 0xffffffff);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          else {
            (*(this->super_Compiler)._vptr_Compiler[6])(&tmp_type,this,(ulong)uVar1,1);
            ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          }
          ::std::__cxx11::string::~string((string *)&tmp_type);
          uVar12 = uVar12 + 1;
          if (uVar12 < (c->m).columns) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (!inside_struct_scope) {
          return __return_storage_ptr__;
        }
        if ((this->backend).boolean_in_struct_remapped_type == Boolean) {
          return __return_storage_ptr__;
        }
        if (*(int *)&(type->super_IVariant).field_0xc != 2) {
          return __return_storage_ptr__;
        }
        SPIRType::SPIRType(&tmp_type,type);
        tmp_type.super_IVariant._12_4_ = (this->backend).boolean_in_struct_remapped_type;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_1a0,this,&tmp_type,0);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1c0,(spirv_cross *)&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b5f90,
                   (char (*) [2])__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,
                   in_R9);
      }
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_1c0);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      SPIRType::~SPIRType(&tmp_type);
      return __return_storage_ptr__;
    }
    if ((this->backend).supports_empty_struct == true) {
      pcVar10 = "{ }";
LAB_00257618:
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,pcVar10,(allocator *)&tmp_type);
      return __return_storage_ptr__;
    }
    if ((this->backend).use_typed_initializer_list == true) {
      ts_1 = (char (*) [6])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&tmp_type,this,type);
      join<std::__cxx11::string,char_const(&)[6]>
                (__return_storage_ptr__,(spirv_cross *)&tmp_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"{ 0 }",ts_1);
    }
    else {
      if ((this->backend).use_initializer_list == true) {
        pcVar10 = "{ 0 }";
        goto LAB_00257618;
      }
      ts_1_00 = (char (*) [4])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&tmp_type,this,type);
      join<std::__cxx11::string,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)&tmp_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x397bfc,
                 ts_1_00);
    }
    ::std::__cxx11::string::~string((string *)&tmp_type);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar8 = 1;
  if ((inside_block_like_struct_scope) &&
     (bVar2 = Compiler::type_is_top_level_array(&this->super_Compiler,type), bVar2)) {
    bVar8 = (this->backend).array_is_value_type_in_buffer_blocks;
  }
  bVar3 = (this->backend).use_initializer_list;
  if ((((bool)bVar3 == true) && ((this->backend).use_typed_initializer_list == true)) &&
     (*(int *)&(type->super_IVariant).field_0xc == 0xf)) {
    bVar2 = Compiler::type_is_top_level_array(&this->super_Compiler,type);
    if (bVar2) {
      bVar3 = (this->backend).use_initializer_list;
      goto LAB_00257472;
    }
    type_to_glsl_constructor_abi_cxx11_(&local_1c0,this,type);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_type,
                     &local_1c0,"{ ");
  }
  else {
LAB_00257472:
    if ((((bVar3 & 1) != 0) && ((this->backend).use_typed_initializer_list == true)) &&
       ((this->backend).array_is_value_type == true)) {
      bVar2 = Compiler::type_is_top_level_array(&this->super_Compiler,type);
      if ((bVar2 & bVar8) != 0) {
        tmp_type.array.super_VectorView<unsigned_int>.ptr = (uint *)&tmp_type.array.stack_storage;
        tmp_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00464260;
        tmp_type.super_IVariant.self.id = 0;
        tmp_type.super_IVariant._12_4_ = 0;
        tmp_type.width = 0;
        tmp_type.vecsize = 1;
        tmp_type.columns = 1;
        tmp_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        tmp_type.array.buffer_capacity = 8;
        tmp_type.array_size_literal.super_VectorView<bool>.ptr =
             (bool *)&tmp_type.array_size_literal.stack_storage;
        tmp_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        tmp_type.array_size_literal.buffer_capacity = 8;
        tmp_type.pointer_depth = 0;
        tmp_type.pointer = false;
        tmp_type.forward_pointer = false;
        tmp_type.storage = StorageClassGeneric;
        tmp_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
             (TypedID<(spirv_cross::Types)1> *)&tmp_type.member_types.stack_storage;
        tmp_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        tmp_type.member_types.buffer_capacity = 8;
        tmp_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
             (uint *)&tmp_type.member_type_index_redirection.stack_storage;
        tmp_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        tmp_type.member_type_index_redirection.buffer_capacity = 8;
        tmp_type.image.type.id = 0;
        tmp_type.type_alias.id = 0;
        tmp_type.parent_type.id = 0;
        tmp_type.member_name_cache._M_h._M_buckets =
             &tmp_type.member_name_cache._M_h._M_single_bucket;
        tmp_type.member_name_cache._M_h._M_bucket_count = 1;
        tmp_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        tmp_type.member_name_cache._M_h._M_element_count = 0;
        tmp_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        tmp_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
        tmp_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
        this_00 = type;
        if (((inside_struct_scope) && ((this->backend).boolean_in_struct_remapped_type != Boolean))
           && (*(int *)&(type->super_IVariant).field_0xc == 2)) {
          this_00 = &tmp_type;
          SPIRType::operator=(this_00,type);
          tmp_type.super_IVariant._12_4_ = (this->backend).boolean_in_struct_remapped_type;
        }
        type_to_glsl_constructor_abi_cxx11_(&local_1a0,this,this_00);
        ::std::operator+(&local_1c0,&local_1a0,"({ ");
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1a0);
        SPIRType::~SPIRType(&tmp_type);
        bVar2 = true;
        goto LAB_0025793a;
      }
      bVar3 = (this->backend).use_initializer_list;
    }
    if ((bVar3 & 1) != 0) {
      ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
      bVar2 = false;
      goto LAB_0025793a;
    }
    type_to_glsl_constructor_abi_cxx11_(&local_1c0,this,type);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_type,
                     &local_1c0,"(");
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&tmp_type);
  ::std::__cxx11::string::~string((string *)&tmp_type);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  bVar2 = false;
LAB_0025793a:
  pTVar9 = (c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
  index = 0;
  for (lVar11 = (c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
                buffer_size << 2; lVar11 != 0; lVar11 = lVar11 + -4) {
    pSVar5 = Compiler::maybe_get<spirv_cross::SPIRConstantOp>(&this->super_Compiler,pTVar9->id);
    if (pSVar5 == (SPIRConstantOp *)0x0) {
      pSVar6 = Compiler::maybe_get<spirv_cross::SPIRUndef>(&this->super_Compiler,pTVar9->id);
      if (pSVar6 == (SPIRUndef *)0x0) {
        c_00 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,pTVar9->id);
        if ((c_00->specialization != true) ||
           (bVar4 = expression_is_forwarded(this,pTVar9->id), bVar4)) {
          bVar4 = Compiler::type_is_top_level_array(&this->super_Compiler,type);
          iVar7 = *(int *)&(type->super_IVariant).field_0xc;
          if (!bVar4 && iVar7 == 0xf) {
            inside_block_like_struct_scope =
                 Compiler::has_member_decoration
                           (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,index,
                            DecorationOffset);
            iVar7 = *(int *)&(type->super_IVariant).field_0xc;
          }
          constant_expression_abi_cxx11_
                    ((string *)&tmp_type,this,c_00,(bool)(inside_block_like_struct_scope & 1),
                     (bool)(inside_struct_scope & 1U | iVar7 == 0xf));
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          inside_struct_scope = (bool)(inside_struct_scope | iVar7 == 0xf);
        }
        else {
          (*(this->super_Compiler)._vptr_Compiler[6])(&tmp_type,this,(ulong)pTVar9->id,1);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[6])(&tmp_type,this,(ulong)pTVar9->id,1);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x18])(&tmp_type,this,pSVar5);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&tmp_type);
    if (pTVar9 != (c->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
                  ptr + ((c->subconstants).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size
                        - 1)) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    index = index + 1;
    pTVar9 = pTVar9 + 1;
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (bVar2) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression(const SPIRConstant &c,
                                         bool inside_block_like_struct_scope,
                                         bool inside_struct_scope)
{
	auto &type = get<SPIRType>(c.constant_type);

	if (type_is_top_level_pointer(type))
	{
		return backend.null_pointer_literal;
	}
	else if (!c.subconstants.empty())
	{
		// Handles Arrays and structures.
		string res;

		// Only consider the decay if we are inside a struct scope where we are emitting a member with Offset decoration.
		// Outside a block-like struct declaration, we can always bind to a constant array with templated type.
		// Should look at ArrayStride here as well, but it's possible to declare a constant struct
		// with Offset = 0, using no ArrayStride on the enclosed array type.
		// A particular CTS test hits this scenario.
		bool array_type_decays = inside_block_like_struct_scope &&
		                         type_is_top_level_array(type) &&
		                         !backend.array_is_value_type_in_buffer_blocks;

		// Allow Metal to use the array<T> template to make arrays a value type
		bool needs_trailing_tracket = false;
		if (backend.use_initializer_list && backend.use_typed_initializer_list && type.basetype == SPIRType::Struct &&
		    !type_is_top_level_array(type))
		{
			res = type_to_glsl_constructor(type) + "{ ";
		}
		else if (backend.use_initializer_list && backend.use_typed_initializer_list && backend.array_is_value_type &&
		         type_is_top_level_array(type) && !array_type_decays)
		{
			const auto *p_type = &type;
			SPIRType tmp_type;

			if (inside_struct_scope &&
			    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
			    type.basetype == SPIRType::Boolean)
			{
				tmp_type = type;
				tmp_type.basetype = backend.boolean_in_struct_remapped_type;
				p_type = &tmp_type;
			}

			res = type_to_glsl_constructor(*p_type) + "({ ";
			needs_trailing_tracket = true;
		}
		else if (backend.use_initializer_list)
		{
			res = "{ ";
		}
		else
		{
			res = type_to_glsl_constructor(type) + "(";
		}

		uint32_t subconstant_index = 0;
		for (auto &elem : c.subconstants)
		{
			if (auto *op = maybe_get<SPIRConstantOp>(elem))
			{
				res += constant_op_expression(*op);
			}
			else if (maybe_get<SPIRUndef>(elem) != nullptr)
			{
				res += to_name(elem);
			}
			else
			{
				auto &subc = get<SPIRConstant>(elem);
				if (subc.specialization && !expression_is_forwarded(elem))
					res += to_name(elem);
				else
				{
					if (!type_is_top_level_array(type) && type.basetype == SPIRType::Struct)
					{
						// When we get down to emitting struct members, override the block-like information.
						// For constants, we can freely mix and match block-like state.
						inside_block_like_struct_scope =
						    has_member_decoration(type.self, subconstant_index, DecorationOffset);
					}

					if (type.basetype == SPIRType::Struct)
						inside_struct_scope = true;

					res += constant_expression(subc, inside_block_like_struct_scope, inside_struct_scope);
				}
			}

			if (&elem != &c.subconstants.back())
				res += ", ";

			subconstant_index++;
		}

		res += backend.use_initializer_list ? " }" : ")";
		if (needs_trailing_tracket)
			res += ")";

		return res;
	}
	else if (type.basetype == SPIRType::Struct && type.member_types.size() == 0)
	{
		// Metal tessellation likes empty structs which are then constant expressions.
		if (backend.supports_empty_struct)
			return "{ }";
		else if (backend.use_typed_initializer_list)
			return join(type_to_glsl(type), "{ 0 }");
		else if (backend.use_initializer_list)
			return "{ 0 }";
		else
			return join(type_to_glsl(type), "(0)");
	}
	else if (c.columns() == 1)
	{
		auto res = constant_expression_vector(c, 0);

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
	else
	{
		string res = type_to_glsl(type) + "(";
		for (uint32_t col = 0; col < c.columns(); col++)
		{
			if (c.specialization_constant_id(col) != 0)
				res += to_name(c.specialization_constant_id(col));
			else
				res += constant_expression_vector(c, col);

			if (col + 1 < c.columns())
				res += ", ";
		}
		res += ")";

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
}